

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

bool __thiscall DnsStats::LoadPcapFiles(DnsStats *this,size_t nb_files,char **fileNames)

{
  ulong local_30;
  size_t i;
  bool ret;
  char **fileNames_local;
  size_t nb_files_local;
  DnsStats *this_local;
  
  i._7_1_ = true;
  for (local_30 = 0; i._7_1_ != false && local_30 < nb_files; local_30 = local_30 + 1) {
    i._7_1_ = LoadPcapFile(this,fileNames[local_30]);
  }
  return i._7_1_;
}

Assistant:

bool DnsStats::LoadPcapFiles(size_t nb_files, char const ** fileNames)
{
    bool ret = true;

    for (size_t i = 0; ret && i < nb_files; i++)
    {
        ret = LoadPcapFile(fileNames[i]);
    }

    return ret;
}